

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

void __thiscall
slang::ast::ForwardingTypedefSymbol::checkType
          (ForwardingTypedefSymbol *this,ForwardTypedefCategory checkCategory,
          Visibility checkVisibility,SourceLocation declLoc)

{
  bool bVar1;
  __optional_ne_t<slang::ast::Visibility,_slang::ast::Visibility> _Var2;
  Scope *pSVar3;
  Diagnostic *pDVar4;
  logic_error *this_00;
  Diagnostic *diag_1;
  string local_160;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  SourceLocation local_38;
  undefined4 local_2c;
  Diagnostic *local_28;
  Diagnostic *diag;
  Visibility checkVisibility_local;
  ForwardTypedefCategory checkCategory_local;
  ForwardingTypedefSymbol *this_local;
  SourceLocation declLoc_local;
  
  diag._0_4_ = checkVisibility;
  diag._4_4_ = checkCategory;
  _checkVisibility_local = this;
  this_local = (ForwardingTypedefSymbol *)declLoc;
  if (((this->category == None) || (checkCategory == None)) || (this->category == checkCategory)) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->visibility);
    if ((bVar1) && (_Var2 = std::operator!=(&this->visibility,(Visibility *)&diag), _Var2)) {
      pSVar3 = Symbol::getParentScope(&this->super_Symbol);
      pDVar4 = Scope::addDiag(pSVar3,(DiagCode)0xa0009,(this->super_Symbol).location);
      Diagnostic::addNote(pDVar4,(DiagCode)0x40001,(SourceLocation)this_local);
    }
    else if (this->next != (ForwardingTypedefSymbol *)0x0) {
      checkType(this->next,diag._4_4_,(Visibility)diag,(SourceLocation)this_local);
    }
  }
  else {
    pSVar3 = Symbol::getParentScope(&this->super_Symbol);
    local_2c = 0x90009;
    local_38 = (this->super_Symbol).location;
    pDVar4 = Scope::addDiag(pSVar3,(DiagCode)0x90009,local_38);
    local_28 = pDVar4;
    switch(this->category) {
    case Enum:
      local_48 = sv("enum",4);
      Diagnostic::operator<<(pDVar4,local_48);
      break;
    case Struct:
      local_58 = sv("struct",6);
      Diagnostic::operator<<(pDVar4,local_58);
      break;
    case Union:
      local_68 = sv("union",5);
      Diagnostic::operator<<(pDVar4,local_68);
      break;
    case Class:
      local_78 = sv("class",5);
      Diagnostic::operator<<(pDVar4,local_78);
      break;
    case InterfaceClass:
      local_88 = sv("interface class",0xf);
      Diagnostic::operator<<(pDVar4,local_88);
      break;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/AllTypes.cpp"
                 ,&local_129);
      std::operator+(&local_108,&local_128,":");
      std::__cxx11::to_string(&local_160,0x482);
      std::operator+(&local_e8,&local_108,&local_160);
      std::operator+(&local_c8,&local_e8,": ");
      std::operator+(&local_a8,&local_c8,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_a8);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    Diagnostic::addNote(local_28,(DiagCode)0x40001,(SourceLocation)this_local);
  }
  return;
}

Assistant:

void ForwardingTypedefSymbol::checkType(ForwardTypedefCategory checkCategory,
                                        Visibility checkVisibility, SourceLocation declLoc) const {
    if (category != ForwardTypedefCategory::None && checkCategory != ForwardTypedefCategory::None &&
        category != checkCategory) {
        auto& diag = getParentScope()->addDiag(diag::ForwardTypedefDoesNotMatch, location);
        switch (category) {
            case ForwardTypedefCategory::Enum:
                diag << "enum"sv;
                break;
            case ForwardTypedefCategory::Struct:
                diag << "struct"sv;
                break;
            case ForwardTypedefCategory::Union:
                diag << "union"sv;
                break;
            case ForwardTypedefCategory::Class:
                diag << "class"sv;
                break;
            case ForwardTypedefCategory::InterfaceClass:
                diag << "interface class"sv;
                break;
            default:
                ASSUME_UNREACHABLE;
        }
        diag.addNote(diag::NoteDeclarationHere, declLoc);
        return;
    }

    if (visibility && visibility != checkVisibility) {
        auto& diag = getParentScope()->addDiag(diag::ForwardTypedefVisibility, location);
        diag.addNote(diag::NoteDeclarationHere, declLoc);
        return;
    }

    if (next)
        next->checkType(checkCategory, checkVisibility, declLoc);
}